

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

int doeat(obj *otmp)

{
  byte bVar1;
  short sVar2;
  boolean bVar3;
  char cVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  obj *poVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  char eat_it_anyway [128];
  char it_or_they [128];
  char foodsmell [256];
  char buf [256];
  obj *in_stack_fffffffffffffcb8;
  char local_338 [128];
  char local_2b8 [128];
  char local_238 [256];
  char local_138 [264];
  
  if (u.uprops[0x22].intrinsic != 0) {
    pcVar12 = "If you can\'t breathe air, how can you consume solids?";
    goto LAB_0018e6e9;
  }
  if (otmp == (obj *)0x0) {
    otmp = floorfood("eat");
    if (otmp == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar3 = validate_object(otmp,"\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n","eat");
    if (bVar3 == '\0') {
      return 0;
    }
  }
  bVar3 = check_capacity((char *)0x0);
  if (bVar3 != '\0') {
    return 0;
  }
  if ((u._1052_1_ & 0x40) != 0) {
    sVar2 = otmp->otyp;
    uVar5 = *(ushort *)&objects[sVar2].field_0x11;
    uVar10 = otmp->corpsenm;
    pcVar12 = Tobjnam(otmp,"smell");
    strcpy(local_238,pcVar12);
    bVar14 = otmp->quan == 1;
    pcVar12 = "they";
    if (bVar14) {
      pcVar12 = "it";
    }
    pcVar13 = "one";
    if (bVar14) {
      pcVar13 = "it";
    }
    strcpy(local_2b8,pcVar12);
    sprintf(local_338,"Eat %s anyway?",pcVar13);
    if ((((long)sVar2 == 0x10e) || (otmp->otyp == 0x129)) || (otmp->otyp == 0x10f)) {
      if (uVar10 == 0xc) {
        if (u.uprops[8].extrinsic == 0) {
LAB_0018e839:
          if (((byte)youmonst.mintrinsics & 0x80) == 0) {
            bVar3 = poly_when_stoned(youmonst.data);
            bVar14 = bVar3 == '\0';
            goto LAB_0018e8ec;
          }
        }
LAB_0018e8e9:
        bVar14 = false;
      }
      else {
        if ((uVar10 == 0xb) && (u.uprops[8].extrinsic == 0)) goto LAB_0018e839;
        if (uVar10 != 0xd7) goto LAB_0018e8e9;
        bVar14 = (youmonst.data != mons + 0xd7 &&
                 (youmonst.data != mons + 0x157 &&
                 (youmonst.data != mons + 0xa0 &&
                 (youmonst.data != mons + 0x20 && youmonst.data != mons + 0x73)))) &&
                 (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0);
      }
LAB_0018e8ec:
      if (sVar2 != 0x10e) goto LAB_0018e95f;
      lVar7 = 0;
      if ((uVar10 != 0xa3) && (uVar10 != 0x154)) {
        lVar7 = peek_at_iced_corpse_age(otmp);
        lVar7 = (long)((ulong)moves - lVar7) / 10;
        if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
          if ((*(uint *)&otmp->field_0x4a & 2) != 0) {
            lVar7 = lVar7 + -2;
          }
        }
        else {
          lVar7 = lVar7 + 2;
        }
      }
    }
    else {
      bVar14 = false;
LAB_0018e95f:
      lVar7 = 0;
    }
    if (((((lVar7 < 6 || uVar10 == 8) || sVar2 != 0x10e) || (u.uprops[0x34].intrinsic != 0)) ||
        (youmonst.data == mons + 0xfd || (youmonst.data)->mlet == ' ')) ||
       (bVar3 = defends(0x21,uwep), bVar3 != '\0')) {
      if (bVar14) {
        pcVar12 = "%s like %s could be something very dangerous! %s";
        goto LAB_0018ed8c;
      }
      if (((*(uint *)&otmp->field_0x4a & 0x300) != 0) || (sVar2 == 0x10e && 3 < lVar7)) {
        pcVar12 = "%s like %s could be rotten! %s";
        goto LAB_0018ed8c;
      }
      if (sVar2 == 0x10e) {
        if (((mons[(int)uVar10].mflags1 >> 0x1c & 1) != 0) &&
           (((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0 ||
             (((u.uprops[6].intrinsic >> 0x1a & 1) != 0 &&
              ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)))) &&
            (((byte)youmonst.mintrinsics & 0x20) == 0)))) {
          pcVar12 = "%s like %s might be poisonous! %s";
          goto LAB_0018ed8c;
        }
        bVar1 = mons[(int)uVar10].mlet;
        if (bVar1 < 0x1f) {
          if (0x15 < bVar1) {
            if ((bVar1 != 0x16) && (bVar1 != 0x19)) goto LAB_0018eb13;
            goto LAB_0018eb2a;
          }
          if ((bVar1 == 2) || (bVar1 == 10)) goto LAB_0018eb2a;
LAB_0018eb13:
          if (u.roleplay.vegetarian == '\0') goto LAB_0018eb2a;
          pcVar12 = "%s unhealthy. %s";
        }
        else {
          if (bVar1 < 0x2a) {
            if (bVar1 == 0x1f) {
              if (uVar10 == 0x9e) goto LAB_0018eb13;
            }
            else if (bVar1 != 0x20) goto LAB_0018eb13;
          }
          else if (bVar1 == 0x2a) {
            if (uVar10 == 0xd6) goto LAB_0018eb13;
          }
          else if ((bVar1 != 0x36) && ((bVar1 != 0x37 || ((uVar10 | 2) == 0x106))))
          goto LAB_0018eb13;
LAB_0018eb2a:
          if ((((mons[(int)uVar10].mflags1 >> 0x1b & 1) == 0) || (u.uprops[7].extrinsic != 0)) ||
             (((byte)youmonst.mintrinsics & 0x40) != 0)) goto LAB_0018eb54;
          pcVar12 = "%s rather acidic. %s";
        }
      }
      else {
LAB_0018eb54:
        if (((u.umonnum != 0xd9) || (u.umonster == 0xd9)) ||
           (((*(uint *)&otmp->field_0x4a >> 0xc & 1) == 0 ||
            ((ushort)((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) - 0x12) < 0xfff9))))
        {
          uVar11 = uVar5 >> 4 & 0x1f;
          if (u.roleplay.vegan != '\0') {
            if ((uVar11 < 0xb) && ((0x684U >> uVar11 & 1) != 0)) {
LAB_0018ebcd:
              pcVar12 = "%s foul and unfamiliar to you. %s";
              goto LAB_0018ec35;
            }
            if (sVar2 == 0x10e) {
              uVar8 = (ulong)(byte)mons[(int)uVar10].mlet;
              if (0x37 < uVar8) goto LAB_0018ebcd;
              if ((0x40000102400404U >> (uVar8 & 0x3f) & 1) == 0) {
                if (uVar8 == 0x1f) {
                  if (uVar10 == 0x9e) goto LAB_0018ebcd;
                }
                else if ((uVar8 != 0x37) || ((uVar10 | 2) == 0x106)) goto LAB_0018ebcd;
              }
            }
          }
          if (u.roleplay.vegetarian != '\0') {
            if (((ushort)uVar11 < 0xb) && ((0x680U >> uVar11 & 1) != 0)) goto LAB_0018ec2e;
            if (sVar2 == 0x10e) {
              bVar1 = mons[(int)uVar10].mlet;
              if (bVar1 < 0x1f) {
                if (bVar1 < 0x16) {
                  if ((bVar1 != 2) && (bVar1 != 10)) {
LAB_0018ec2e:
                    pcVar12 = "%s unfamiliar to you. %s";
                    goto LAB_0018ec35;
                  }
                }
                else if ((bVar1 != 0x16) && (bVar1 != 0x19)) goto LAB_0018ec2e;
              }
              else if (bVar1 < 0x2a) {
                if (bVar1 == 0x1f) {
                  if (uVar10 == 0x9e) goto LAB_0018ec2e;
                }
                else if (bVar1 != 0x20) goto LAB_0018ec2e;
              }
              else if (bVar1 == 0x2a) {
                if (uVar10 == 0xd6) goto LAB_0018ec2e;
              }
              else if ((bVar1 != 0x36) && ((bVar1 != 0x37 || ((uVar10 | 2) == 0x106))))
              goto LAB_0018ec2e;
            }
          }
          if (((lVar7 < 6 || uVar10 == 8) || sVar2 != 0x10e) ||
             (((u.uprops[0x34].intrinsic == 0 &&
               (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
              (bVar3 = defends(0x21,uwep), bVar3 == '\0')))) goto LAB_0018edfc;
          goto LAB_0018ed85;
        }
        pcVar12 = "%s disgusting to you right now. %s";
      }
LAB_0018ec35:
      sprintf(local_138,pcVar12,local_238,local_338);
    }
    else {
LAB_0018ed85:
      pcVar12 = "%s like %s could be tainted! %s";
LAB_0018ed8c:
      sprintf(local_138,pcVar12,local_238,local_2b8,local_338);
    }
    cVar4 = yn_function(local_138,"yn",'n');
    pcVar12 = body_part(0x11);
    pline("Your %s stops tingling and your sense of smell returns to normal.",pcVar12);
    u._1052_1_ = u._1052_1_ & 0xbf;
    if (cVar4 == 'n') {
      return 0;
    }
  }
LAB_0018edfc:
  bVar3 = is_edible(otmp);
  if (bVar3 == '\0') {
    pcVar12 = "You cannot eat that!";
LAB_0018e6e9:
    pline(pcVar12);
    return 0;
  }
  if ((otmp->owornmask & 0x19007fU) != 0) {
    pcVar12 = "You can\'t eat something you\'re wearing.";
    goto LAB_0018e6e9;
  }
  sVar2 = otmp->otyp;
  uVar5 = *(ushort *)&objects[sVar2].field_0x11 >> 4;
  if (((10 < (uVar5 & 0x1f)) && ((uVar5 & 0x1f) < 0x12)) &&
     ((u.umonnum == 0xd9 && ((*(uint *)&otmp->field_0x4a >> 0xc & 1) != 0)))) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a | 0x80;
    if (1 < otmp->quan) {
      if (otmp->where == '\x03') {
        otmp = splitobj(otmp,1);
      }
      else {
        splitobj(otmp,(ulong)(otmp->quan - 1));
      }
    }
    pcVar12 = xname(otmp);
    pline("Ulch!  That %s was rustproofed!",pcVar12);
    otmp->field_0x4b = otmp->field_0x4b & 0xef;
    uVar10 = u.uprops[0x1b].intrinsic;
    uVar11 = mt_random();
    make_stunned((ulong)(uVar10 + uVar11 % 10),'\x01');
    pcVar12 = xname(otmp);
    pcVar12 = the(pcVar12);
    pcVar13 = surface((int)u.ux,(int)u.uy);
    pline("You spit %s out onto the %s.",pcVar12,pcVar13);
    if (otmp->where == '\x03') {
      freeinv(otmp);
      dropy(otmp);
    }
    stackobj(in_stack_fffffffffffffcb8);
    return 1;
  }
  if (sVar2 == 0xb4) {
    pline("This ring is indigestible!");
    rottenfood(otmp);
    if ((otmp->field_0x4a & 0x20) == 0) {
      return 1;
    }
    if ((objects[otmp->otyp].field_0x10 & 1) == 0) {
      if (objects[otmp->otyp].oc_uname == (char *)0x0) {
        docall(otmp);
        return 1;
      }
      return 1;
    }
    return 1;
  }
  bVar1 = otmp->oclass;
  if (bVar1 == 7) {
    poVar9 = victual.piece;
    if (otmp == victual.piece) {
      bVar14 = true;
      if (((youmonst.data)->mlet != '0') && (((youmonst.data)->mflags2 & 0x100) == 0)) {
        bVar14 = youmonst.data == mons + 0x85;
      }
      poVar9 = otmp;
      if (bVar14 != ((*(uint *)&otmp->field_0x4a >> 0x1b & 1) != 0)) {
        victual.piece = (obj *)0x0;
        poVar9 = (obj *)0x0;
      }
    }
    if ((otmp == poVar9) && (poVar9 = otmp, (otmp->field_0x4d & 8) != 0)) {
      lVar7 = peek_at_iced_corpse_age(otmp);
      poVar9 = victual.piece;
      if (lVar7 + victual.usedtime + 5 < (long)(ulong)moves) {
        victual.piece = (obj *)0x0;
        poVar9 = (obj *)0x0;
      }
    }
    if (otmp == poVar9) {
      if (u.uhs != 0) {
        victual._20_1_ = victual._20_1_ & 0xfe;
      }
      victual.piece = touchfood(otmp);
      pline("You resume your meal.");
      start_eating(victual.piece);
      return 1;
    }
    if (otmp->otyp == 0x129) {
      start_tin(otmp);
      return 1;
    }
    poVar9 = touchfood(otmp);
    victual._8_8_ = victual._8_8_ & 0xffffffff00000000;
    sVar2 = poVar9->otyp;
    victual.piece = poVar9;
    if ((long)sVar2 == 0x10e) {
      iVar6 = eatcorpse(poVar9);
      if (iVar6 != 0) {
        if (iVar6 == 2) {
          victual.piece = (obj *)0x0;
          return 1;
        }
        if (iVar6 == 3) {
          victual.piece = (obj *)0x0;
          if (((poVar9->field_0x4d & 8) == 0) &&
             (poVar9->oeaten == (uint)mons[poVar9->corpsenm].cnutrit)) {
            poVar9->oeaten = 0;
          }
          u.uconduct.food = u.uconduct.food - 1;
          return 0;
        }
        bVar14 = false;
        goto LAB_0018f47d;
      }
    }
    else {
      if ((*(ushort *)&objects[sVar2].field_0x11 & 0x1f0) == 0x40) {
        uVar10 = sVar2 == 0x10f ^ 7;
      }
      else {
        uVar10 = ((ushort)(sVar2 - 0x11fU) < 5) + 5;
      }
      violated(uVar10);
      victual.reqtime = (int)objects[poVar9->otyp].oc_delay;
      if ((long)poVar9->otyp != 0x122) {
        uVar10 = *(uint *)&poVar9->field_0x4a;
        if ((uVar10 & 1) == 0) {
          uVar11 = 0x32;
          if ((uVar10 & 2) == 0) {
            uVar11 = 0x1e;
          }
          if ((moves - poVar9->age <= uVar11) ||
             (((uVar10 & 0x300) == 0 && (uVar10 = mt_random(), 0x24924924 < uVar10 * -0x49249249))))
          goto LAB_0018f3d8;
        }
        iVar6 = rottenfood(poVar9);
        bVar14 = iVar6 == 0;
        if (!bVar14) {
          *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a & 0xfffffcff | 0x100;
        }
        if (poVar9->oeaten < 2) {
          victual.piece = (obj *)0x0;
          if (poVar9->where == '\x03') {
            useup(poVar9);
            return 1;
          }
          useupf(poVar9,1);
          return 1;
        }
        poVar9->oeaten = poVar9->oeaten >> 1;
        goto LAB_0018f47d;
      }
LAB_0018f3d8:
      fprefx(poVar9);
    }
    bVar14 = true;
LAB_0018f47d:
    if ((long)poVar9->otyp == 0x10e) {
      uVar5 = mons[poVar9->corpsenm].cnutrit;
      uVar11 = (uint)uVar5;
      uVar10 = poVar9->oeaten;
      if ((poVar9->field_0x4d & 8) != 0) {
        uVar11 = ((uint)uVar5 * 4) / 5;
        uVar10 = uVar10 - uVar11;
        uVar11 = uVar5 - uVar11;
      }
    }
    else {
      uVar11 = (uint)objects[poVar9->otyp].oc_nutrition;
      uVar10 = poVar9->oeaten;
    }
    if (uVar11 == 0) {
      victual._8_8_ = victual._8_8_ & 0xffffffff;
      victual.nmod = 0;
    }
    else {
      iVar6 = rounddiv((long)victual.reqtime * (long)(int)uVar10,uVar11);
      victual.reqtime = iVar6;
      victual.nmod = 0;
      if (uVar10 != 0 && iVar6 != 0) {
        if ((int)uVar10 < iVar6) {
          victual.nmod = iVar6 % (int)uVar10;
        }
        else {
          victual.nmod = -((int)uVar10 / iVar6);
        }
      }
    }
    victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
    if (bVar14) {
      start_eating(poVar9);
      return 1;
    }
    return 1;
  }
  victual.usedtime = 0;
  victual.reqtime = 1;
  victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
  victual.piece = otmp;
  if (bVar1 - 0xf < 2) {
    victual.nmod = weight(otmp);
    uVar5 = *(ushort *)&objects[otmp->otyp].field_0x11 >> 4;
  }
  else if (bVar1 == 0xc) {
    victual.nmod = 2000;
    if (otmp->quan < 0x30d41) {
      victual.nmod = otmp->quan / 100;
    }
  }
  else {
    victual.nmod = (uint)objects[sVar2].oc_nutrition;
  }
  victual._20_1_ = victual._20_1_ | 4;
  uVar5 = (uVar5 & 0x1f) - 2;
  iVar6 = 5;
  if (uVar5 < 9) {
    iVar6 = *(int *)(&DAT_002aa570 + (ulong)uVar5 * 4);
  }
  violated(iVar6);
  if ((otmp->field_0x4a & 1) != 0) {
    rottenfood(otmp);
  }
  uVar10 = *(uint *)&otmp->field_0x4a;
  if (otmp->oclass == '\x02') {
    if ((short)uVar10 < 0) {
      pline("Ecch - that must have been poisonous!");
      if (u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) {
        if (((byte)youmonst.mintrinsics & 0x20) == 0) {
          uVar10 = mt_random();
          losestr((uVar10 & 3) + 1,'\0');
          uVar11 = 0xf;
          uVar10 = u.uprops[6].intrinsic;
          if ((u.uprops[6].intrinsic >> 0x1a & 1) != 0) goto LAB_0018f22c;
          goto LAB_0018f259;
        }
      }
      else if ((((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
               ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) &&
              (uVar10 = 0, ((byte)youmonst.mintrinsics & 0x20) == 0)) {
LAB_0018f22c:
        uVar11 = 0xf;
        if ((uVar10 & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0) {
          uVar11 = (uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 8 + 7;
        }
LAB_0018f259:
        uVar10 = mt_random();
        pcVar12 = xname(otmp);
        losehp(uVar10 % uVar11 + 1,pcVar12,0);
        goto LAB_0018f289;
      }
      pline("You seem unaffected by the poison.");
      goto LAB_0018f289;
    }
    if ((uVar10 & 1) != 0) goto LAB_0018f289;
LAB_0018f11b:
    pcVar12 = singular(otmp,xname);
  }
  else {
    if ((uVar10 & 1) != 0) goto LAB_0018f289;
    if (otmp->oclass != '\f') goto LAB_0018f11b;
    pcVar12 = foodword(otmp);
  }
  pline("This %s is delicious!",pcVar12);
LAB_0018f289:
  eatspecial();
  return 1;
}

Assistant:

int doeat(struct obj *otmp)	/* generic "eat" command funtion (see cmd.c) */
{
	int basenutrit;			/* nutrition of full item */
	int nutrit;			/* nutrition available */
	boolean dont_start = FALSE;
	
	if (Strangled) {
		pline("If you can't breathe air, how can you consume solids?");
		return 0;
	}
	if (otmp && !validate_object(otmp, allobj, "eat"))
		return 0;
	else if (!otmp)
		otmp = floorfood("eat");
	if (!otmp) return 0;
	if (check_capacity(NULL)) return 0;

	if (u.uedibility) {
		int res = edibility_prompts(otmp);
		if (res) {
		    pline("Your %s stops tingling and your sense of smell returns to normal.",
			body_part(NOSE));
		    u.uedibility = 0;
		    if (res == 1) return 0;
		}
	}

	/* We have to make non-foods take 1 move to eat, unless we want to
	 * do ridiculous amounts of coding to deal with partly eaten plate
	 * mails, players who polymorph back to human in the middle of their
	 * metallic meal, etc....
	 */
	if (!is_edible(otmp)) {
	    pline("You cannot eat that!");
	    return 0;
	} else if ((otmp->owornmask & (W_ARMOR | W_TOOL | W_AMUL | W_SADDLE)) != 0) {
	    /* let them eat rings */
	    pline("You can't eat something you're wearing.");
	    return 0;
	}
	if (is_metallic(otmp) &&
	    u.umonnum == PM_RUST_MONSTER && otmp->oerodeproof) {
	    	otmp->rknown = TRUE;
		if (otmp->quan > 1L) {
		    if (!carried(otmp))
			splitobj(otmp, otmp->quan - 1L);
		    else
			otmp = splitobj(otmp, 1L);
		}
		pline("Ulch!  That %s was rustproofed!", xname(otmp));
		/* The regurgitated object's rustproofing is gone now */
		otmp->oerodeproof = 0;
		make_stunned(HStun + rn2(10), TRUE);
		pline("You spit %s out onto the %s.", the(xname(otmp)),
			surface(u.ux, u.uy));
		if (carried(otmp)) {
			freeinv(otmp);
			dropy(otmp);
		}
		stackobj(otmp);
		return 1;
	}
	/* KMH -- Slow digestion is... indigestible */
	if (otmp->otyp == RIN_SLOW_DIGESTION) {
		pline("This ring is indigestible!");
		rottenfood(otmp);
		if (otmp->dknown && !objects[otmp->otyp].oc_name_known
				&& !objects[otmp->otyp].oc_uname)
			docall(otmp);
		return 1;
	}
	if (otmp->oclass != FOOD_CLASS) {
	    int material;
	    victual.reqtime = 1;
	    victual.piece = otmp;
		/* Don't split it, we don't need to if it's 1 move */
	    victual.usedtime = 0;
	    victual.canchoke = (u.uhs == SATIATED);
		/* Note: gold weighs 1 pt. for each 1000 pieces (see */
		/* pickup.c) so gold and non-gold is consistent. */
	    if (otmp->oclass == COIN_CLASS)
		basenutrit = ((otmp->quan > 200000L) ? 2000
			: (int)(otmp->quan/100L));
	    else if (otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS)
		basenutrit = weight(otmp);
	    /* oc_nutrition is usually weight anyway */
	    else basenutrit = objects[otmp->otyp].oc_nutrition;
	    victual.nmod = basenutrit;
	    victual.eating = TRUE; /* needed for lesshungry() */

	    /* Eating non-food-objects breaks food-conducts here */
	    material = objects[otmp->otyp].oc_material;
	    if (material == LEATHER || material == BONE || material == DRAGON_HIDE)
		violated(CONDUCT_VEGETARIAN);
	    else if (material == WAX)
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    if (otmp->cursed)
		rottenfood(otmp);

	    if (otmp->oclass == WEAPON_CLASS && otmp->opoisoned) {
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
		    if (!Poison_resistance)
			losestr(rnd(4), FALSE);
		    losehp(rnd(PPoison_resistance ? 7 : 15),
			   xname(otmp), KILLED_BY_AN);
		} else {
		    pline("You seem unaffected by the poison.");
		}
	    } else if (!otmp->cursed)
		pline("This %s is delicious!",
		      otmp->oclass == COIN_CLASS ? foodword(otmp) :
		      singular(otmp, xname));

	    eatspecial();
	    return 1;
	}

	/* [ALI] Hero polymorphed in the meantime. */
	if (otmp == victual.piece && is_vampiric(youmonst.data) != otmp->odrained)
	    victual.piece = NULL;	/* can't resume */

	/* [ALI] Blood can coagulate during the interruption
	 *       but not during the draining process.
	 */
	if (otmp == victual.piece && otmp->odrained &&
	    peek_at_iced_corpse_age(otmp) + victual.usedtime + 5 < moves)
	    victual.piece = NULL;	/* can't resume */

	if (otmp == victual.piece) {
	/* If they weren't able to choke, they don't suddenly become able to
	 * choke just because they were interrupted.  On the other hand, if
	 * they were able to choke before, if they lost food it's possible
	 * they shouldn't be able to choke now.
	 */
	    if (u.uhs != SATIATED) victual.canchoke = FALSE;
	    victual.piece = touchfood(otmp);
	    pline("You resume your meal.");
	    start_eating(victual.piece);
	    return 1;
	}

	/* nothing in progress - so try to find something. */
	/* tins are a special case */
	/* tins must also check conduct separately in case they're discarded */
	if (otmp->otyp == TIN) {
	    start_tin(otmp);
	    return 1;
	}

	victual.piece = otmp = touchfood(otmp);
	victual.usedtime = 0;

	/* Now we need to calculate delay and nutritional info.
	 * The base nutrition calculated here and in eatcorpse() accounts
	 * for normal vs. rotten food.  The reqtime and nutrit values are
	 * then adjusted in accordance with the amount of food left.
	 */
	if (otmp->otyp == CORPSE) {
	    int tmp = eatcorpse(otmp);
	    if (tmp == 3) {
		/* inedible */
		victual.piece = NULL;

		/* The combination of odrained == TRUE and oeaten == cnutrit
		 * represents the case of starting to drain a corpse but not
		 * getting any further (e.g. losing consciousness due to
		 * rotten food). We must preserve this case to avoid corpses
		 * changing appearance after a failed attempt to eat.
		 */
		if (!otmp->odrained && otmp->oeaten == mons[otmp->corpsenm].cnutrit)
		    otmp->oeaten = 0;
		/* ALI, conduct: didn't eat it after all */
		u.uconduct.food--;
		return 0;
	    } else if (tmp == 2) {
		/* used up */
		victual.piece = NULL;
		return 1;
	    } else if (tmp)
		dont_start = TRUE;
	    /* if not used up, eatcorpse sets up reqtime and may modify
	     * oeaten */
	} else {
	    /* No checks for WAX, LEATHER, BONE, DRAGON_HIDE.  These are
	     * all handled in the != FOOD_CLASS case, above */
	    switch (objects[otmp->otyp].oc_material) {
	    case FLESH:
		if (otmp->otyp == EGG)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_VEGETARIAN);
		break;

	    default:
		if (otmp->otyp == PANCAKE ||
		    otmp->otyp == FORTUNE_COOKIE || /* eggs */
		    otmp->otyp == CREAM_PIE ||
		    otmp->otyp == CANDY_BAR || /* milk */
		    otmp->otyp == LUMP_OF_ROYAL_JELLY)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_FOODLESS);
		break;
	    }

	    victual.reqtime = objects[otmp->otyp].oc_delay;
	    if (otmp->otyp != FORTUNE_COOKIE &&
		(otmp->cursed ||
		 (((moves - otmp->age) > (otmp->blessed ? 50 : 30)) &&
		(otmp->orotten || !rn2(7))))) {

		if (rottenfood(otmp)) {
		    otmp->orotten = TRUE;
		    dont_start = TRUE;
		}
		if (otmp->oeaten < 2) {
		    victual.piece = NULL;
		    if (carried(otmp)) useup(otmp);
		    else useupf(otmp, 1L);
		    return 1;
		} else {
		    consume_oeaten(otmp, 1);	/* oeaten >>= 1 */
		}
	    } else fprefx(otmp);
	}

	/* re-calc the nutrition */
	if (otmp->otyp == CORPSE) basenutrit = mons[otmp->corpsenm].cnutrit;
	else basenutrit = objects[otmp->otyp].oc_nutrition;
	nutrit = otmp->oeaten;
	if (otmp->otyp == CORPSE && otmp->odrained) {
	    nutrit -= drainlevel(otmp);
	    basenutrit -= drainlevel(otmp);
	}

	victual.reqtime = (basenutrit == 0 ? 0 :
		rounddiv(victual.reqtime * (long)nutrit, basenutrit));

	/* calculate the modulo value (nutrit. units per round eating)
	 * note: this isn't exact - you actually lose a little nutrition
	 *	 due to this method.
	 * TODO: add in a "remainder" value to be given at the end of the
	 *	 meal.
	 */
	if (victual.reqtime == 0 || nutrit == 0)
	    /* possible if most has been eaten before */
	    victual.nmod = 0;
	else if (nutrit >= victual.reqtime)
	    victual.nmod = -(nutrit / victual.reqtime);
	else
	    victual.nmod = victual.reqtime % nutrit;
	victual.canchoke = (u.uhs == SATIATED);

	if (!dont_start) start_eating(otmp);
	return 1;
}